

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O2

Dar_Cut_t * Dar_ObjComputeCuts(Dar_Man_t *p,Aig_Obj_t *pObj,int fSkipTtMin)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Dar_Cut_t *pDVar8;
  Dar_Cut_t *pDVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  Dar_Cut_t *pDVar13;
  ulong uVar14;
  uint uVar15;
  int Var;
  int iVar16;
  uint uVar17;
  Dar_Cut_t *pDVar18;
  Dar_Cut_t *pCut1;
  Dar_Cut_t *pCut1_00;
  int iVar;
  ulong uVar19;
  int i;
  uint uVar20;
  bool bVar21;
  
  pAVar6 = Aig_ObjReal_rec(pObj->pFanin0);
  pAVar7 = Aig_ObjReal_rec(pObj->pFanin1);
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2eb,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ec,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  if ((pObj->field_5).pData != (void *)0x0) {
    __assert_fail("Dar_ObjCuts(pObj) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ed,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  uVar12 = (ulong)pAVar6 & 0xfffffffffffffffe;
  if (*(long *)(uVar12 + 0x28) == 0) {
    __assert_fail("Dar_ObjCuts(pFaninR0) != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ee,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  uVar19 = (ulong)pAVar7 & 0xfffffffffffffffe;
  if (*(long *)(uVar19 + 0x28) == 0) {
    __assert_fail("Dar_ObjCuts(pFaninR1) != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2ef,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
  }
  pDVar8 = Dar_ObjPrepareCuts(p,pObj);
  pCut1 = *(Dar_Cut_t **)(uVar12 + 0x28);
  uVar11 = 0;
  do {
    if (*(byte *)(uVar12 + 0x1f) <= uVar11) {
      lVar10 = (long)(pObj->field_5).pData + 4;
      for (uVar11 = 0; uVar11 < (byte)pObj->field_0x1f; uVar11 = uVar11 + 1) {
        if ((*(byte *)(lVar10 + 3) & 0x10) != 0) {
          p->nCutsUsed = p->nCutsUsed + 1;
        }
        lVar10 = lVar10 + 0x18;
      }
      p->nCutsUsed = p->nCutsUsed + -1;
      return pDVar8;
    }
    if ((pCut1->field_0x7 & 0x10) != 0) {
      pCut1_00 = *(Dar_Cut_t **)(uVar19 + 0x28);
      for (uVar15 = 0; uVar15 < *(byte *)(uVar19 + 0x1f); uVar15 = uVar15 + 1) {
        if (((pCut1_00->field_0x7 & 0x10) != 0) &&
           (p->nCutsAll = p->nCutsAll + 1, uVar2 = pCut1_00->uSign | pCut1->uSign,
           uVar2 = (uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555),
           uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333),
           uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707),
           uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f),
           (uVar2 >> 0x10) + (uVar2 & 0xffff) < 5)) {
          pDVar9 = (Dar_Cut_t *)(pObj->field_5).pData;
          uVar5 = (uint)(byte)pObj->field_0x1f;
          uVar4 = (uint)(byte)pObj->field_0x1f;
          pDVar13 = (Dar_Cut_t *)0x0;
          pDVar18 = pDVar9;
          uVar2 = uVar4;
          while (bVar21 = uVar2 != 0, uVar2 = uVar2 - 1, bVar21) {
            uVar20 = *(uint *)&pDVar18->field_0x4;
            if ((uVar20 >> 0x1c & 1) == 0) goto LAB_00425c96;
            if ((0x5fffffff < uVar20) &&
               ((pDVar13 == (Dar_Cut_t *)0x0 ||
                ((uVar20 >> 0x10 & 0x7ff) < (*(ushort *)&pDVar13->field_0x6 & 0x7ff))))) {
              pDVar13 = pDVar18;
            }
            pDVar18 = pDVar18 + 1;
          }
          if (pDVar13 == (Dar_Cut_t *)0x0) {
            pDVar13 = (Dar_Cut_t *)0x0;
            pDVar18 = pDVar9;
            while (bVar21 = uVar4 != 0, uVar4 = uVar4 - 1, bVar21) {
              if ((0x3fffffff < *(uint *)&pDVar18->field_0x4) &&
                 ((pDVar13 == (Dar_Cut_t *)0x0 ||
                  ((*(uint *)&pDVar18->field_0x4 >> 0x10 & 0x7ff) <
                   (*(ushort *)&pDVar13->field_0x6 & 0x7ff))))) {
                pDVar13 = pDVar18;
              }
              pDVar18 = pDVar18 + 1;
            }
            if (pDVar13 == (Dar_Cut_t *)0x0) {
              pDVar13 = (Dar_Cut_t *)0x0;
              while (bVar21 = uVar5 != 0, uVar5 = uVar5 - 1, bVar21) {
                if ((pDVar13 == (Dar_Cut_t *)0x0) ||
                   ((*(ushort *)&pDVar9->field_0x6 & 0x7ff) <
                    (*(ushort *)&pDVar13->field_0x6 & 0x7ff))) {
                  pDVar13 = pDVar9;
                }
                pDVar9 = pDVar9 + 1;
              }
              if (pDVar13 == (Dar_Cut_t *)0x0) {
                __assert_fail("pCutMax != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                              ,0xae,"Dar_Cut_t *Dar_CutFindFree(Dar_Man_t *, Aig_Obj_t *)");
              }
            }
          }
          pDVar13->field_0x7 = pDVar13->field_0x7 & 0xef;
          pDVar18 = pDVar13;
LAB_00425c96:
          pDVar9 = pCut1;
          pDVar13 = pCut1_00;
          if (*(uint *)&pCut1_00->field_0x4 >> 0x1d < *(uint *)&pCut1->field_0x4 >> 0x1d) {
            pDVar9 = pCut1_00;
            pDVar13 = pCut1;
          }
          iVar3 = Dar_CutMergeOrdered(pDVar18,pDVar13,pDVar9);
          if (iVar3 == 0) {
            if ((pDVar18->field_0x7 & 0x10) != 0) {
              __assert_fail("!pCut->fUsed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                            ,0x300,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
            }
          }
          else {
            pDVar18->uSign = pCut1_00->uSign | pCut1->uSign;
            pDVar18->field_0x7 = pDVar18->field_0x7 | 0x10;
            p->nCutsTried = p->nCutsTried + 1;
            iVar3 = Dar_CutFilter(pObj,pDVar18);
            if (iVar3 == 0) {
              uVar2 = *(uint *)&pCut1->field_0x4;
              uVar1 = *(ushort *)&pCut1_00->field_0x4;
              uVar4 = Dar_CutTruthPhase(pDVar18,pCut1);
              uVar4 = Dar_CutTruthStretch(uVar2 & 0xffff ^ -((uint)pAVar6 & 1),uVar2 >> 0x1d,uVar4);
              uVar2 = *(uint *)&pCut1_00->field_0x4;
              uVar5 = Dar_CutTruthPhase(pDVar18,pCut1_00);
              uVar5 = Dar_CutTruthStretch((uint)uVar1 ^ -((uint)pAVar7 & 1),uVar2 >> 0x1d,uVar5);
              uVar2 = *(uint *)&pDVar18->field_0x4;
              *(short *)&pDVar18->field_0x4 = (short)(uVar5 & uVar4);
              if (fSkipTtMin == 0) {
                if ((uVar2 >> 0x1c & 1) == 0) {
                  __assert_fail("pCut->fUsed",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                ,0x262,"int Dar_CutSuppMinimize(Dar_Cut_t *)");
                }
                uVar5 = uVar5 & uVar4 & 0xffff;
                uVar2 = uVar2 >> 0x1d;
                uVar20 = 0;
                uVar4 = uVar2;
                for (uVar14 = 0; uVar2 != uVar14; uVar14 = uVar14 + 1) {
                  uVar17 = 1 << ((byte)uVar14 & 0x1f);
                  bVar21 = ((&DAT_0080d290)[uVar14 * 2] & uVar5) ==
                           ((&DAT_0080d294)[uVar14 * 2] & uVar5) >> ((byte)uVar17 & 0x1f);
                  if (bVar21) {
                    uVar17 = 0;
                  }
                  uVar20 = uVar20 | uVar17;
                  uVar4 = uVar4 - bVar21;
                }
                if (uVar4 != uVar2) {
                  iVar3 = -1;
                  iVar16 = 0;
                  for (uVar2 = 0; uVar2 != 4; uVar2 = uVar2 + 1) {
                    iVar = iVar3;
                    if ((uVar20 >> (uVar2 & 0x1f) & 1) != 0) {
                      for (; iVar16 < iVar + 1; iVar = iVar + -1) {
                        uVar5 = Dar_CutTruthSwapAdjacentVars(uVar5,iVar);
                      }
                      iVar16 = iVar16 + 1;
                    }
                    iVar3 = iVar3 + 1;
                  }
                  uVar2 = (uint)*(ushort *)&pDVar18->field_0x6 << 0x10 | uVar5 & 0xffff;
                  *(uint *)&pDVar18->field_0x4 = uVar2;
                  pDVar18->uSign = 0;
                  uVar5 = 0;
                  for (uVar14 = 0; uVar14 < uVar2 >> 0x1d; uVar14 = uVar14 + 1) {
                    if ((uVar20 >> ((uint)uVar14 & 0x1f) & 1) != 0) {
                      iVar3 = pDVar18->pLeaves[uVar14];
                      lVar10 = (long)(int)uVar5;
                      uVar5 = uVar5 + 1;
                      pDVar18->pLeaves[lVar10] = iVar3;
                      pDVar18->uSign = pDVar18->uSign | 1 << ((byte)iVar3 & 0x1f);
                      uVar2 = *(uint *)&pDVar18->field_0x4;
                    }
                  }
                  if (uVar5 != uVar4) {
                    __assert_fail("k == nLeaves",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                  ,0x278,"int Dar_CutSuppMinimize(Dar_Cut_t *)");
                  }
                  *(uint *)&pDVar18->field_0x4 = uVar2 & 0x1fffffff | uVar4 << 0x1d;
                  iVar3 = Dar_CutFilter(pObj,pDVar18);
                  if (iVar3 != 0) {
                    __assert_fail("!RetValue",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                                  ,0x311,
                                  "Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
                  }
                }
              }
              uVar4 = Dar_CutFindValue(p,pDVar18);
              uVar2 = *(uint *)&pDVar18->field_0x4;
              *(uint *)&pDVar18->field_0x4 = uVar2 & 0xf800ffff | (uVar4 & 0x7ff) << 0x10;
              if ((uVar4 & 0x7ff) == 0) {
                p->nCutsSkipped = p->nCutsSkipped + 1;
                pDVar18->field_0x7 = pDVar18->field_0x7 & 0xef;
              }
              else if (uVar2 < 0x40000000) {
                return pDVar8;
              }
            }
            else if ((pDVar18->field_0x7 & 0x10) != 0) {
              __assert_fail("!pCut->fUsed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                            ,0x307,"Dar_Cut_t *Dar_ObjComputeCuts(Dar_Man_t *, Aig_Obj_t *, int)");
            }
          }
        }
        pCut1_00 = pCut1_00 + 1;
      }
    }
    uVar11 = uVar11 + 1;
    pCut1 = pCut1 + 1;
  } while( true );
}

Assistant:

Dar_Cut_t * Dar_ObjComputeCuts( Dar_Man_t * p, Aig_Obj_t * pObj, int fSkipTtMin )
{
    Aig_Obj_t * pFanin0 = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
    Aig_Obj_t * pFanin1 = Aig_ObjReal_rec( Aig_ObjChild1(pObj) );
    Aig_Obj_t * pFaninR0 = Aig_Regular(pFanin0);
    Aig_Obj_t * pFaninR1 = Aig_Regular(pFanin1);
    Dar_Cut_t * pCutSet, * pCut0, * pCut1, * pCut;
    int i, k; 

    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    assert( Dar_ObjCuts(pObj) == NULL );
    assert( Dar_ObjCuts(pFaninR0) != NULL );
    assert( Dar_ObjCuts(pFaninR1) != NULL );

    // set up the first cut
    pCutSet = Dar_ObjPrepareCuts( p, pObj );
    // make sure fanins cuts are computed
    Dar_ObjForEachCut( pFaninR0, pCut0, i )
    Dar_ObjForEachCut( pFaninR1, pCut1, k )
    {
        p->nCutsAll++;
        // make sure K-feasible cut exists
        if ( Dar_WordCountOnes(pCut0->uSign | pCut1->uSign) > 4 )
            continue;
        // get the next cut of this node
        pCut = Dar_CutFindFree( p, pObj );
        // create the new cut
        if ( !Dar_CutMerge( pCut, pCut0, pCut1 ) )
        {
            assert( !pCut->fUsed );
            continue;
        }
        p->nCutsTried++;
        // check dominance
        if ( Dar_CutFilter( pObj, pCut ) )
        {
            assert( !pCut->fUsed );
            continue;
        }
        // compute truth table
        pCut->uTruth = 0xFFFF & Dar_CutTruth( pCut, pCut0, pCut1, Aig_IsComplement(pFanin0), Aig_IsComplement(pFanin1) );

        // minimize support of the cut
        if ( !fSkipTtMin && Dar_CutSuppMinimize( pCut ) )
        {
            int RetValue = Dar_CutFilter( pObj, pCut );
            assert( !RetValue );
        }

        // assign the value of the cut
        pCut->Value = Dar_CutFindValue( p, pCut );
        // if the cut contains removed node, do not use it
        if ( pCut->Value == 0 )
        {
            p->nCutsSkipped++;
            pCut->fUsed = 0;
        }
        else if ( pCut->nLeaves < 2 )
            return pCutSet;
    }
    // count the number of nontrivial cuts cuts
    Dar_ObjForEachCut( pObj, pCut, i )
        p->nCutsUsed += pCut->fUsed;
    // discount trivial cut
    p->nCutsUsed--;
    return pCutSet;
}